

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O3

void __thiscall
QVLABase<QJustificationPoint>::reallocate_impl
          (QVLABase<QJustificationPoint> *this,qsizetype prealloc,void *array,qsizetype asize,
          qsizetype aalloc)

{
  long lVar1;
  long lVar2;
  void *__src;
  undefined1 auVar3 [16];
  ulong __size;
  ulong uVar4;
  void *__dest;
  size_t uCapacity;
  
  lVar1 = (this->super_QVLABaseBase).a;
  lVar2 = (this->super_QVLABaseBase).s;
  if (lVar2 < asize) {
    asize = lVar2;
  }
  if (lVar1 == aalloc) {
    (this->super_QVLABaseBase).s = asize;
    return;
  }
  __src = (this->super_QVLABaseBase).ptr;
  __dest = array;
  if (prealloc < aalloc) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = aalloc;
    __size = SUB168(auVar3 * ZEXT816(0x38),0);
    if (SUB168(auVar3 * ZEXT816(0x38),8) == 0) {
      uVar4 = QtPrivate::expectedAllocSize(__size,0x10);
      if (uVar4 != 0) {
        aalloc = uVar4 / 0x38;
        __size = aalloc * 0x38;
      }
      if (__size != 0) {
        __dest = malloc(__size);
        prealloc = aalloc;
        goto LAB_005051bf;
      }
    }
    __dest = (void *)0x0;
    prealloc = aalloc;
  }
LAB_005051bf:
  if (asize != 0) {
    memcpy(__dest,__src,asize * 0x38);
  }
  (this->super_QVLABaseBase).ptr = __dest;
  (this->super_QVLABaseBase).a = prealloc;
  (this->super_QVLABaseBase).s = asize;
  if ((__src != array) && (__src != __dest)) {
    QtPrivate::sizedFree(__src,lVar1 * 0x38);
    return;
  }
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QVLABase<T>::reallocate_impl(qsizetype prealloc, void *array, qsizetype asize, qsizetype aalloc)
{
    Q_ASSERT(aalloc >= asize);
    Q_ASSERT(data());
    T *oldPtr = data();
    qsizetype osize = size();
    const qsizetype oalloc = capacity();

    const qsizetype copySize = qMin(asize, osize);
    Q_ASSERT(copySize >= 0);

    if (aalloc != oalloc) {
        QVLABaseBase::malloced_ptr guard;
        void *newPtr;
        qsizetype newA;
        if (aalloc > prealloc) {
            newPtr = QtPrivate::fittedMalloc(0, &aalloc, sizeof(T));
            guard.reset(newPtr);
            Q_CHECK_PTR(newPtr); // could throw
            // by design: in case of QT_NO_EXCEPTIONS malloc must not fail or it crashes here
            newA = aalloc;
        } else {
            newPtr = array;
            newA = prealloc;
        }
        QtPrivate::q_uninitialized_relocate_n(oldPtr, copySize,
                                              reinterpret_cast<T *>(newPtr));
        // commit:
        ptr = newPtr;
        guard.release();
        a = newA;
    }
    s = copySize;

    // destroy remaining old objects
    if constexpr (QTypeInfo<T>::isComplex) {
        if (osize > asize)
            std::destroy(oldPtr + asize, oldPtr + osize);
    }

    if (oldPtr != reinterpret_cast<T *>(array) && oldPtr != data())
        QtPrivate::sizedFree(oldPtr, oalloc, sizeof(T));
}